

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

void __thiscall
GlobOpt::TrackIntSpecializedAddSubConstant
          (GlobOpt *this,Instr *instr,AddSubConstantInfo *addSubConstantInfo,Value *dstValue,
          bool updateSourceBounds)

{
  int32 *key;
  ValueNumber VVar1;
  Opnd *pOVar2;
  Instr *pIVar3;
  _func_int **pp_Var4;
  BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *pBVar5;
  Loop *pLVar6;
  ValueInfo *this_00;
  code *pcVar7;
  bool bVar8;
  bool bVar9;
  OpndKind OVar10;
  BOOLEAN BVar11;
  ValueNumber VVar12;
  int32 iVar13;
  undefined4 *puVar14;
  StackSym *pSVar15;
  RegOpnd *pRVar16;
  StackSym *pSVar17;
  ulong uVar18;
  Value *pVVar19;
  IntBounds *this_01;
  IntBoundedValueInfo *newValueInfo;
  undefined1 local_68 [8];
  InductionVariable *inductionVariable;
  InductionVariable *local_50;
  InductionVariable *inductionVariable_1;
  Value *local_40;
  GlobOpt *local_38;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = this;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c6,"(instr)","instr");
    if (!bVar9) goto LAB_004aa95c;
    *puVar14 = 0;
    this = local_38;
  }
  if (dstValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    local_38 = this;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2c7,"(dstValue)","dstValue");
    if (!bVar9) goto LAB_004aa95c;
    *puVar14 = 0;
    this = local_38;
  }
  if (addSubConstantInfo == (AddSubConstantInfo *)0x0) {
    if ((*(uint *)&this->field_0xf4 & 0x40) == 0) {
      return;
    }
    *(uint *)&this->field_0xf4 = *(uint *)&this->field_0xf4 & 0xffffffbf;
    if (this->prePassLoop == (Loop *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x375,"(IsLoopPrePass())","IsLoopPrePass()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    if (instr->m_opcode != Ld_A) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x376,"(instr->m_opcode == Js::OpCode::Ld_A)",
                         "instr->m_opcode == Js::OpCode::Ld_A");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    uVar18 = (ulong)instr->m_prev->m_opcode;
    if ((0x33 < uVar18) || ((0x820c000000000U >> (uVar18 & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37b,
                         "(instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_prev->m_opcode == Js::OpCode::Incr_A || instr->m_prev->m_opcode == Js::OpCode::Decr_A || instr->m_prev->m_opcode == Js::OpCode::Add_A || instr->m_prev->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    pOVar2 = instr->m_prev->m_dst;
    OVar10 = IR::Opnd::GetKind(pOVar2);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    pp_Var4 = pOVar2[1]._vptr_Opnd;
    pOVar2 = instr->m_src1;
    OVar10 = IR::Opnd::GetKind(pOVar2);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      local_38 = this;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
      this = local_38;
    }
    if (pp_Var4 != pOVar2[1]._vptr_Opnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37c,
                         "(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym)"
                         ,
                         "instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym"
                        );
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    pBVar5 = &((this->currentBlock->globOptData).inductionVariables)->
              super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    pOVar2 = instr->m_dst;
    OVar10 = IR::Opnd::GetKind(pOVar2);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    bVar9 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>
                      (pBVar5,(uint *)(pOVar2[1]._vptr_Opnd + 2),(InductionVariable **)local_68,
                       (int *)&local_50);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x37f,
                         "(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable))"
                         ,
                         "currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable)"
                        );
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    InductionVariable::SetSymValueNumber((InductionVariable *)local_68,dstValue->valueNumber);
    return;
  }
  local_38 = (GlobOpt *)addSubConstantInfo;
  if (addSubConstantInfo->srcSym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cb,"(addSubConstantInfo->HasInfo())","addSubConstantInfo->HasInfo()");
    if (!bVar9) goto LAB_004aa95c;
    *puVar14 = 0;
  }
  if ((this->field_0xf4 & 4) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar9 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x2cc,"(!ignoredIntOverflowForCurrentInstr)",
                       "!ignoredIntOverflowForCurrentInstr");
    if (!bVar9) goto LAB_004aa95c;
    *puVar14 = 0;
  }
  if ((this->prePassLoop != (Loop *)0x0) && (bVar9 = DoBoundCheckHoist(this), bVar9)) {
    if ((0x33 < (ulong)instr->m_opcode) ||
       ((0x820c000000000U >> ((ulong)instr->m_opcode & 0x3f) & 1) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x2d8,
                         "(instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A)"
                         ,
                         "instr->m_opcode == Js::OpCode::Incr_A || instr->m_opcode == Js::OpCode::Decr_A || instr->m_opcode == Js::OpCode::Add_A || instr->m_opcode == Js::OpCode::Sub_A"
                        );
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    pOVar2 = instr->m_dst;
    local_40 = dstValue;
    OVar10 = IR::Opnd::GetKind(pOVar2);
    if (OVar10 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    pSVar17 = (StackSym *)pOVar2[1]._vptr_Opnd;
    pSVar15 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)local_38);
    inductionVariable_1 = (InductionVariable *)pSVar17;
    if (pSVar15 == pSVar17) {
      bVar9 = false;
    }
    else {
      pIVar3 = instr->m_prev;
      if (pIVar3 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x2e8,"(prevInstr)","prevInstr");
        if (!bVar9) goto LAB_004aa95c;
        *puVar14 = 0;
      }
      if ((pIVar3->m_opcode == Conv_Num) &&
         (OVar10 = IR::Opnd::GetKind(pIVar3->m_src1), OVar10 == OpndKindReg)) {
        pOVar2 = pIVar3->m_src1;
        OVar10 = IR::Opnd::GetKind(pOVar2);
        if (OVar10 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar9) goto LAB_004aa95c;
          *puVar14 = 0;
        }
        if ((InductionVariable *)pOVar2[1]._vptr_Opnd != inductionVariable_1) goto LAB_004aa03e;
        pRVar16 = IR::Opnd::AsRegOpnd(pIVar3->m_dst);
        pSVar17 = pRVar16->m_sym;
        pSVar15 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)local_38);
        if (pSVar17 != pSVar15) goto LAB_004aa03e;
        bVar8 = true;
        bVar9 = true;
        dstValue = local_40;
      }
      else {
LAB_004aa03e:
        pIVar3 = instr->m_next;
        if (pIVar3 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                             ,0x2f6,"(nextInstr)","nextInstr");
          if (!bVar9) goto LAB_004aa95c;
          *puVar14 = 0;
        }
        dstValue = local_40;
        if ((pIVar3->m_opcode == Ld_A) &&
           (OVar10 = IR::Opnd::GetKind(pIVar3->m_src1), OVar10 == OpndKindReg)) {
          pOVar2 = pIVar3->m_src1;
          OVar10 = IR::Opnd::GetKind(pOVar2);
          if (OVar10 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar14 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar9) goto LAB_004aa95c;
            *puVar14 = 0;
            dstValue = local_40;
          }
          if ((InductionVariable *)pOVar2[1]._vptr_Opnd != inductionVariable_1) goto LAB_004aa152;
          pSVar17 = AddSubConstantInfo::SrcSym((AddSubConstantInfo *)local_38);
          pRVar16 = IR::Opnd::AsRegOpnd(pIVar3->m_dst);
          inductionVariable_1 = (InductionVariable *)pSVar17;
          if (pRVar16->m_sym != pSVar17) goto LAB_004aa152;
          this->field_0xf4 = this->field_0xf4 | 0x40;
          bVar8 = true;
        }
        else {
LAB_004aa152:
          bVar8 = false;
        }
        bVar9 = false;
      }
      if (!bVar8) goto LAB_004aa77a;
    }
    if (bVar9) {
      pVVar19 = GlobOptBlockData::FindValue
                          (&this->currentBlock->globOptData,(Sym *)inductionVariable_1);
      if (pVVar19 == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                           ,0x310,"(value)","value");
        if (!bVar9) goto LAB_004aa95c;
        *puVar14 = 0;
      }
    }
    else {
      pVVar19 = AddSubConstantInfo::SrcValue((AddSubConstantInfo *)local_38);
    }
    VVar1 = pVVar19->valueNumber;
    pBVar5 = &((this->currentBlock->globOptData).inductionVariables)->
              super_BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ;
    if (pBVar5 == (BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x318,"(inductionVariables)","inductionVariables");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    key = &(inductionVariable_1->changeBounds).upperBound;
    bVar9 = JsUtil::
            BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::TryGetReference<unsigned_int>(pBVar5,(uint *)key,&local_50,(int *)local_68);
    if (bVar9) {
      bVar9 = InductionVariable::IsChangeDeterminate(local_50);
      if (bVar9) {
        VVar12 = InductionVariable::SymValueNumber(local_50);
        dstValue = local_40;
        if (VVar1 == VVar12) {
          InductionVariable::SetSymValueNumber(local_50,local_40->valueNumber);
          if (this->prePassLoop == this->currentBlock->loop) {
            iVar13 = AddSubConstantInfo::Offset((AddSubConstantInfo *)local_38);
            bVar9 = InductionVariable::Add(local_50,iVar13);
            if (!bVar9) {
              this->field_0xf4 = this->field_0xf4 & 0xbf;
            }
          }
          goto LAB_004aa77a;
        }
        InductionVariable::SetChangeIsIndeterminate(local_50);
      }
    }
    else {
      pLVar6 = this->currentBlock->loop;
      if ((((this->prePassLoop == pLVar6) &&
           (pVVar19 = GlobOptBlockData::FindValue
                                (&pLVar6->landingPad->globOptData,(Sym *)inductionVariable_1),
           pVVar19 != (Value *)0x0)) && (VVar1 == pVVar19->valueNumber)) &&
         (BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this->currentBlock->loop->symsDefInLoop,*key), dstValue = local_40,
         BVar11 == '\0')) {
        VVar1 = local_40->valueNumber;
        iVar13 = AddSubConstantInfo::Offset((AddSubConstantInfo *)local_38);
        InductionVariable::InductionVariable
                  ((InductionVariable *)local_68,(StackSym *)inductionVariable_1,VVar1,iVar13);
        JsUtil::
        BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Add((BaseHashSet<InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_unsigned_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               *)pBVar5,(InductionVariable *)local_68);
        goto LAB_004aa77a;
      }
    }
    this->field_0xf4 = this->field_0xf4 & 0xbf;
    dstValue = local_40;
  }
LAB_004aa77a:
  if (updateSourceBounds && this->prePassLoop == (Loop *)0x0) {
    AddSubConstantInfo::Offset((AddSubConstantInfo *)local_38);
    pVVar19 = AddSubConstantInfo::SrcValue((AddSubConstantInfo *)local_38);
    this_00 = pVVar19->valueInfo;
    bVar9 = ValueType::IsInt(&this_00->super_ValueType);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x355,"(valueInfo->IsInt())","valueInfo->IsInt()");
      if (!bVar9) goto LAB_004aa95c;
      *puVar14 = 0;
    }
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    bVar9 = ValueInfo::TryGetIntConstantBounds(this_00,(IntConstantBounds *)local_68,false);
    if (!bVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x357,"(valueInfo->TryGetIntConstantBounds(&constantBounds))",
                         "valueInfo->TryGetIntConstantBounds(&constantBounds)");
      if (!bVar9) {
LAB_004aa95c:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar14 = 0;
    }
    bVar9 = ValueInfo::HasIntConstantValue(dstValue->valueInfo,false);
    this_01 = GetIntBoundsToUpdate(this,this_00,(IntConstantBounds *)local_68,true,bVar9,true,true);
    if (this_01 != (IntBounds *)0x0) {
      VVar1 = pVVar19->valueNumber;
      inductionVariable_1 = (InductionVariable *)this_00;
      iVar13 = AddSubConstantInfo::Offset((AddSubConstantInfo *)local_38);
      local_38 = (GlobOpt *)pVVar19;
      IntBounds::SetLowerBound(this_01,VVar1,dstValue,-iVar13,true);
      IntBounds::SetUpperBound(this_01,VVar1,dstValue,-iVar13,true);
      newValueInfo = NewIntBoundedValueInfo(this,(ValueInfo *)inductionVariable_1,this_01);
      ChangeValueInfo(this,(BasicBlock *)0x0,(Value *)local_38,&newValueInfo->super_ValueInfo,false,
                      false);
    }
  }
  return;
}

Assistant:

void GlobOpt::TrackIntSpecializedAddSubConstant(
    IR::Instr *const instr,
    const AddSubConstantInfo *const addSubConstantInfo,
    Value *const dstValue,
    const bool updateSourceBounds)
{
    Assert(instr);
    Assert(dstValue);

    if(addSubConstantInfo)
    {
        Assert(addSubConstantInfo->HasInfo());
        Assert(!ignoredIntOverflowForCurrentInstr);
        do
        {
            if(!IsLoopPrePass() || !DoBoundCheckHoist())
            {
                break;
            }

            Assert(
                instr->m_opcode == Js::OpCode::Incr_A ||
                instr->m_opcode == Js::OpCode::Decr_A ||
                instr->m_opcode == Js::OpCode::Add_A ||
                instr->m_opcode == Js::OpCode::Sub_A);

            StackSym *sym = instr->GetDst()->AsRegOpnd()->m_sym;
            bool isPostfixIncDecPattern = false;
            if(addSubConstantInfo->SrcSym() != sym)
            {
                // Check for the following patterns.
                //
                // This pattern is used for postfix inc/dec operators:
                //     s2 = Conv_Num s1
                //     s1 = Inc s2
                //
                // This pattern is used for prefix inc/dec operators:
                //     s2 = Inc s1
                //     s1 = Ld s2
                IR::Instr *const prevInstr = instr->m_prev;
                Assert(prevInstr);
                if(prevInstr->m_opcode == Js::OpCode::Conv_Num &&
                    prevInstr->GetSrc1()->IsRegOpnd() &&
                    prevInstr->GetSrc1()->AsRegOpnd()->m_sym == sym &&
                    prevInstr->GetDst()->AsRegOpnd()->m_sym == addSubConstantInfo->SrcSym())
                {
                    // s2 will get a new value number, since Conv_Num cannot transfer in the prepass. For the purposes of
                    // induction variable tracking however, it doesn't matter, so record this case and use s1's value in the
                    // current block.
                    isPostfixIncDecPattern = true;
                }
                else
                {
                    IR::Instr *const nextInstr = instr->m_next;
                    Assert(nextInstr);
                    if(nextInstr->m_opcode != Js::OpCode::Ld_A ||
                        !nextInstr->GetSrc1()->IsRegOpnd() ||
                        nextInstr->GetSrc1()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }
                    sym = addSubConstantInfo->SrcSym();
                    if(nextInstr->GetDst()->AsRegOpnd()->m_sym != sym)
                    {
                        break;
                    }

                    // In the prefix inc/dec pattern, the result of Ld currently gets a new value number, which will cause the
                    // induction variable info to become indeterminate. Indicate that the value number should be updated in the
                    // induction variable info.
                    // Consider: Remove this once loop prepass value transfer scheme is fixed
                    updateInductionVariableValueNumber = true;
                }
            }

            // Track induction variable info
            ValueNumber srcValueNumber;
            if(isPostfixIncDecPattern)
            {
                Value *const value = this->currentBlock->globOptData.FindValue(sym);
                Assert(value);
                srcValueNumber = value->GetValueNumber();
            }
            else
            {
                srcValueNumber = addSubConstantInfo->SrcValue()->GetValueNumber();
            }
            InductionVariableSet *const inductionVariables = currentBlock->globOptData.inductionVariables;
            Assert(inductionVariables);
            InductionVariable *inductionVariable;
            if(!inductionVariables->TryGetReference(sym->m_id, &inductionVariable))
            {
                // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated
                // for use by the parent loop, so changes in the current loop have already been tracked.
                if(prePassLoop != currentBlock->loop)
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }

                // Ensure that the sym is live in the landing pad, and that its value has not changed in an unknown way yet
                Value *const landingPadValue = currentBlock->loop->landingPad->globOptData.FindValue(sym);
                if(!landingPadValue || srcValueNumber != landingPadValue->GetValueNumber() || currentBlock->loop->symsDefInLoop->Test(sym->m_id))
                {
                    updateInductionVariableValueNumber = false;
                    break;
                }
                inductionVariables->Add(
                    InductionVariable(sym, dstValue->GetValueNumber(), addSubConstantInfo->Offset()));
                break;
            }

            if(!inductionVariable->IsChangeDeterminate())
            {
                updateInductionVariableValueNumber = false;
                break;
            }

            if(srcValueNumber != inductionVariable->SymValueNumber())
            {
                // The sym's value has changed since the last time induction variable info was recorded for it. Due to the
                // unknown change, mark the info as indeterminate.
                inductionVariable->SetChangeIsIndeterminate();
                updateInductionVariableValueNumber = false;
                break;
            }

            // Only track changes in the current loop's prepass. In subsequent prepasses, the info is only being propagated for
            // use by the parent loop, so changes in the current loop have already been tracked. Induction variable value
            // numbers are updated as changes occur, but their change bounds are preserved from the first prepass over the loop.
            inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
            if(prePassLoop != currentBlock->loop)
            {
                break;
            }

            if(!inductionVariable->Add(addSubConstantInfo->Offset()))
            {
                updateInductionVariableValueNumber = false;
            }
        } while(false);

        if(!this->IsLoopPrePass() && updateSourceBounds && addSubConstantInfo->Offset() != IntConstMin)
        {
            // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track
            // that it is equal to (the value of 'a') + 2. That part has been done above. Similarly, the value of 'a' should
            // also track that it is equal to (the value of 'b') - 2.
            Value *const value = addSubConstantInfo->SrcValue();
            const ValueInfo *const valueInfo = value->GetValueInfo();
            Assert(valueInfo->IsInt());
            IntConstantBounds constantBounds;
            AssertVerify(valueInfo->TryGetIntConstantBounds(&constantBounds));
            IntBounds *const bounds =
                GetIntBoundsToUpdate(
                    valueInfo,
                    constantBounds,
                    true,
                    dstValue->GetValueInfo()->HasIntConstantValue(),
                    true,
                    true);
            if(bounds)
            {
                const ValueNumber valueNumber = value->GetValueNumber();
                const int32 dstOffset = -addSubConstantInfo->Offset();
                bounds->SetLowerBound(valueNumber, dstValue, dstOffset, true);
                bounds->SetUpperBound(valueNumber, dstValue, dstOffset, true);
                ChangeValueInfo(nullptr, value, NewIntBoundedValueInfo(valueInfo, bounds));
            }
        }
        return;
    }

    if(!updateInductionVariableValueNumber)
    {
        return;
    }

    // See comment above where this is set to true
    // Consider: Remove this once loop prepass value transfer scheme is fixed
    updateInductionVariableValueNumber = false;

    Assert(IsLoopPrePass());
    Assert(instr->m_opcode == Js::OpCode::Ld_A);
    Assert(
        instr->m_prev->m_opcode == Js::OpCode::Incr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Decr_A ||
        instr->m_prev->m_opcode == Js::OpCode::Add_A ||
        instr->m_prev->m_opcode == Js::OpCode::Sub_A);
    Assert(instr->m_prev->GetDst()->AsRegOpnd()->m_sym == instr->GetSrc1()->AsRegOpnd()->m_sym);

    InductionVariable *inductionVariable;
    AssertVerify(currentBlock->globOptData.inductionVariables->TryGetReference(instr->GetDst()->AsRegOpnd()->m_sym->m_id, &inductionVariable));
    inductionVariable->SetSymValueNumber(dstValue->GetValueNumber());
}